

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdcolmap.c
# Opt level: O0

uint read_pbm_integer(j_decompress_ptr cinfo,FILE *infile)

{
  int iVar1;
  long *in_RDI;
  uint val;
  int ch;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  uint local_18;
  
  do {
    iVar1 = pbm_getc((FILE *)CONCAT17(in_stack_ffffffffffffffe7,
                                      CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0))
                    );
    if (iVar1 == -1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x412;
      (**(code **)*in_RDI)(in_RDI);
    }
    in_stack_ffffffffffffffe7 = true;
    if (((iVar1 != 0x20) && (in_stack_ffffffffffffffe7 = true, iVar1 != 9)) &&
       (in_stack_ffffffffffffffe7 = true, iVar1 != 10)) {
      in_stack_ffffffffffffffe7 = iVar1 == 0xd;
    }
  } while ((bool)in_stack_ffffffffffffffe7 != false);
  if ((iVar1 < 0x30) || (0x39 < iVar1)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x412;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_18 = iVar1 - 0x30;
  while( true ) {
    iVar1 = pbm_getc((FILE *)CONCAT17(in_stack_ffffffffffffffe7,
                                      CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0))
                    );
    in_stack_ffffffffffffffe6 = 0x2f < iVar1 && iVar1 < 0x3a;
    if (0x2f >= iVar1 || iVar1 >= 0x3a) break;
    local_18 = iVar1 + -0x30 + local_18 * 10;
  }
  return local_18;
}

Assistant:

LOCAL(unsigned int)
read_pbm_integer(j_decompress_ptr cinfo, FILE *infile)
/* Read an unsigned decimal integer from the PPM file */
/* Swallows one trailing character after the integer */
/* Note that on a 16-bit-int machine, only values up to 64k can be read. */
/* This should not be a problem in practice. */
{
  register int ch;
  register unsigned int val;

  /* Skip any leading whitespace */
  do {
    ch = pbm_getc(infile);
    if (ch == EOF)
      ERREXIT(cinfo, JERR_BAD_CMAP_FILE);
  } while (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r');

  if (ch < '0' || ch > '9')
    ERREXIT(cinfo, JERR_BAD_CMAP_FILE);

  val = ch - '0';
  while ((ch = pbm_getc(infile)) >= '0' && ch <= '9') {
    val *= 10;
    val += ch - '0';
  }
  return val;
}